

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O0

token * cast_expression(dmr_C *C,token *token,expression **tree)

{
  int iVar1;
  token *ptVar2;
  int local_4c;
  symbol *psStack_48;
  int is_force;
  symbol *sym;
  expression *v;
  expression *cast;
  token *next;
  expression **tree_local;
  token *token_local;
  dmr_C *C_local;
  
  next = (token *)tree;
  tree_local = (expression **)token;
  token_local = (token *)C;
  iVar1 = dmrC_match_op(token,0x28);
  if (iVar1 != 0) {
    cast = tree_local[1];
    iVar1 = dmrC_lookup_type((token *)cast);
    if (iVar1 != 0) {
      v = dmrC_alloc_expression((dmr_C *)token_local,*(position *)cast,0xb);
      tree_local = (expression **)
                   dmrC_typename((dmr_C *)token_local,(token *)cast,&stack0xffffffffffffffb8,
                                 &local_4c);
      (v->field_5).field_4.symbol = psStack_48;
      tree_local = (expression **)
                   dmrC_expect_token((dmr_C *)token_local,(token *)tree_local,0x29,
                                     "at end of cast operator");
      iVar1 = dmrC_match_op((token *)tree_local,0x7b);
      if (iVar1 != 0) {
        if (local_4c != 0) {
          dmrC_warning((dmr_C *)token_local,psStack_48->pos,"[force] in compound literal");
        }
        tree_local = (expression **)
                     dmrC_initializer((dmr_C *)token_local,&(v->field_5).field_6.right,
                                      (token *)tree_local);
        ptVar2 = postfix_expression((dmr_C *)token_local,(token *)tree_local,(expression **)next,v);
        return ptVar2;
      }
      next->pos = (position)v;
      if (local_4c != 0) {
        *(ushort *)v = *(ushort *)v & 0xff00 | 0xc;
      }
      ptVar2 = cast_expression((dmr_C *)token_local,(token *)tree_local,(expression **)&sym);
      if (sym == (symbol *)0x0) {
        return ptVar2;
      }
      (v->field_5).field_2.string = (string *)sym;
      if ((*(ushort *)sym >> 8 & 1) != 0) {
        *(ushort *)v = *(ushort *)v & 0xff | 0x100;
        return ptVar2;
      }
      if ((*(ushort *)sym >> 8 & 2) == 0) {
        return ptVar2;
      }
      *(ushort *)v = *(ushort *)v & 0xff | 0x300;
      return ptVar2;
    }
  }
  ptVar2 = unary_expression((dmr_C *)token_local,(token *)tree_local,(expression **)next);
  return ptVar2;
}

Assistant:

static struct token *cast_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	if (dmrC_match_op(token, '(')) {
		struct token *next = token->next;
		if (dmrC_lookup_type(next)) {
			struct expression *cast = dmrC_alloc_expression(C, next->pos, EXPR_CAST);
			struct expression *v;
			struct symbol *sym;
			int is_force;

			token = dmrC_typename(C, next, &sym, &is_force);
			cast->cast_type = sym;
			token = dmrC_expect_token(C, token, ')', "at end of cast operator");
			if (dmrC_match_op(token, '{')) {
				if (is_force)
					dmrC_warning(C, sym->pos,
						"[force] in compound literal");
				token = dmrC_initializer(C, &cast->cast_expression, token);
				return postfix_expression(C, token, tree, cast);
			}
			*tree = cast;
			if (is_force)
				cast->type = EXPR_FORCE_CAST;
			token = cast_expression(C, token, &v);
			if (!v)
				return token;
			cast->cast_expression = v;
			if (v->flags & Int_const_expr)
				cast->flags = Int_const_expr;
			else if (v->flags & Float_literal) /* and _not_ int */
				cast->flags = Int_const_expr | Float_literal;
			return token;
		}
	}
	return unary_expression(C, token, tree);
}